

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O0

void stun_attr_msgint_init(stun_attr_msgint *attr,stun_msg_hdr *msg_hdr,void *key,size_t key_len)

{
  size_t sVar1;
  undefined1 local_118 [8];
  HMAC_SHA1_CTX ctx;
  uint8_t *p_end;
  uint8_t *p;
  size_t key_len_local;
  void *key_local;
  stun_msg_hdr *msg_hdr_local;
  stun_attr_msgint *attr_local;
  
  sVar1 = stun_msg_len(msg_hdr);
  ctx._216_8_ = msg_hdr->tsx_id + (sVar1 - 0x20);
  HMAC_SHA1_Init((HMAC_SHA1_CTX *)local_118,(uint8_t *)key,key_len);
  HMAC_SHA1_Update((HMAC_SHA1_CTX *)local_118,(uint8_t *)msg_hdr,ctx._216_8_ - (long)msg_hdr);
  HMAC_SHA1_Final(attr->hmac,(HMAC_SHA1_CTX *)local_118);
  return;
}

Assistant:

void stun_attr_msgint_init(stun_attr_msgint *attr,
                           const stun_msg_hdr *msg_hdr,
                           const void *key, size_t key_len) {
  uint8_t *p = (uint8_t *)msg_hdr;
  uint8_t *p_end = p + stun_msg_len(msg_hdr) - sizeof(*attr);
  HMAC_SHA1_CTX ctx;
  HMAC_SHA1_Init(&ctx, (const uint8_t*)key, key_len);
  HMAC_SHA1_Update(&ctx, p, p_end - p);
  HMAC_SHA1_Final(attr->hmac, &ctx);
}